

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3rbu_savestate(sqlite3rbu *p)

{
  sqlite3_file *psVar1;
  char *zSql;
  char *zBegin;
  sqlite3_file *pDb;
  int rc;
  sqlite3rbu *p_local;
  
  pDb._4_4_ = p->rc;
  if (pDb._4_4_ == 0x65) {
    p_local._4_4_ = 0;
  }
  else {
    if ((p->eStage == 1) && (pDb._4_4_ == 0)) {
      pDb._4_4_ = sqlite3_exec(p->dbMain,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
    }
    if ((pDb._4_4_ == 0) && (p->eStage == 4)) {
      psVar1 = p->pTargetFd->pReal;
      pDb._4_4_ = (*psVar1->pMethods->xSync)(psVar1,2);
    }
    p->rc = pDb._4_4_;
    rbuSaveState(p,p->eStage);
    pDb._4_4_ = p->rc;
    if (p->eStage == 1) {
      if (pDb._4_4_ == 0) {
        pDb._4_4_ = sqlite3_exec(p->dbRbu,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
      }
      if (pDb._4_4_ == 0) {
        zSql = "BEGIN IMMEDIATE";
        if (p->zTarget == (char *)0x0) {
          zSql = "BEGIN";
        }
        pDb._4_4_ = sqlite3_exec(p->dbRbu,zSql,(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
      }
      if (pDb._4_4_ == 0) {
        pDb._4_4_ = sqlite3_exec(p->dbMain,"BEGIN IMMEDIATE",(sqlite3_callback)0x0,(void *)0x0,
                                 (char **)0x0);
      }
    }
    p->rc = pDb._4_4_;
    p_local._4_4_ = pDb._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3rbu_savestate(sqlite3rbu *p){
  int rc = p->rc;
  if( rc==SQLITE_DONE ) return SQLITE_OK;

  assert( p->eStage>=RBU_STAGE_OAL && p->eStage<=RBU_STAGE_DONE );
  if( p->eStage==RBU_STAGE_OAL ){
    assert( rc!=SQLITE_DONE );
    if( rc==SQLITE_OK ) rc = sqlite3_exec(p->dbMain, "COMMIT", 0, 0, 0);
  }

  /* Sync the db file */
  if( rc==SQLITE_OK && p->eStage==RBU_STAGE_CKPT ){
    sqlite3_file *pDb = p->pTargetFd->pReal;
    rc = pDb->pMethods->xSync(pDb, SQLITE_SYNC_NORMAL);
  }

  p->rc = rc;
  rbuSaveState(p, p->eStage);
  rc = p->rc;

  if( p->eStage==RBU_STAGE_OAL ){
    assert( rc!=SQLITE_DONE );
    if( rc==SQLITE_OK ) rc = sqlite3_exec(p->dbRbu, "COMMIT", 0, 0, 0);
    if( rc==SQLITE_OK ){ 
      const char *zBegin = rbuIsVacuum(p) ? "BEGIN" : "BEGIN IMMEDIATE";
      rc = sqlite3_exec(p->dbRbu, zBegin, 0, 0, 0);
    }
    if( rc==SQLITE_OK ) rc = sqlite3_exec(p->dbMain, "BEGIN IMMEDIATE", 0, 0,0);
  }

  p->rc = rc;
  return rc;
}